

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* pstore::path::win32::split_drive
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *path)

{
  size_type sVar1;
  long lVar2;
  long lVar3;
  size_type sVar4;
  string normp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (path->_M_string_length < 2) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[1],_true>(__return_storage_ptr__,(char (*) [1])0x18a748,path);
    return __return_storage_ptr__;
  }
  normp._M_dataplus._M_p = (pointer)&normp.field_2;
  normp._M_string_length = 0;
  normp.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&normp);
  sVar1 = path->_M_string_length;
  for (sVar4 = 0; sVar1 != sVar4; sVar4 = sVar4 + 1) {
    std::__cxx11::string::push_back((char)&normp);
  }
  if (normp._M_string_length < 3) {
    if (normp._M_string_length == 2) goto LAB_0017f2f7;
LAB_0017f34c:
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[1],_true>(__return_storage_ptr__,(char (*) [1])0x18a748,path);
  }
  else {
    if ((((*normp._M_dataplus._M_p == '/') && (normp._M_string_length != 3)) &&
        (normp._M_dataplus._M_p[1] == '/')) && (normp._M_dataplus._M_p[2] != '/')) {
      lVar2 = std::__cxx11::string::find((char)&normp,0x2f);
      if (lVar2 == -1) {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[1],_true>(__return_storage_ptr__,(char (*) [1])0x18a748,path);
        goto LAB_0017f35e;
      }
      lVar3 = std::__cxx11::string::find((char)&normp,0x2f);
      if (lVar3 == lVar2 + 1) {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[1],_true>(__return_storage_ptr__,(char (*) [1])0x18a748,path);
        goto LAB_0017f35e;
      }
      std::__cxx11::string::substr((ulong)&local_70,(ulong)path);
      std::__cxx11::string::substr((ulong)&local_50,(ulong)path);
    }
    else {
LAB_0017f2f7:
      if (normp._M_dataplus._M_p[1] != ':') goto LAB_0017f34c;
      std::__cxx11::string::substr((ulong)&local_70,(ulong)path);
      std::__cxx11::string::substr((ulong)&local_50,(ulong)path);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,&local_70,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
LAB_0017f35e:
  std::__cxx11::string::~string((string *)&normp);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::string> split_drive (std::string const & path) {
                if (path.length () <= 1) {
                    return {"", path};
                }

                // Normalize the slash direction.
                std::string normp;
                normp.reserve (path.length ());
                std::transform (std::begin (path), std::end (path), std::back_inserter (normp),
                                [] (char const c) { return c == '\\' ? '/' : c; });

                if ((normp.length () > 2 && normp[0] == '/' && normp[1] == '/') &&
                    (normp.length () > 3 && normp[2] != '/')) {
                    // This is is a UNC path:
                    // vvvvvvvvvvvvvvvvvvvv drive letter or UNC path
                    // \\machine\mountpoint\directory\etc\...
                    //           directory ^^^^^^^^^^^^^^^
                    std::string::size_type const index = normp.find ('/', 2);
                    if (index == std::string::npos) {
                        return {"", path};
                    }

                    std::string::size_type index2 = normp.find ('/', index + 1);
                    // An UNC path can't have two slashes in a row (after the initial two)
                    if (index2 == index + 1) {
                        return {"", path};
                    }
                    if (index2 == std::string::npos) {
                        index2 = path.length ();
                    }
                    return {path.substr (0, index2), path.substr (index2, std::string::npos)};
                }
                if (normp.length () > 1 && normp[1] == ':') {
                    return {path.substr (0, 2), path.substr (2, std::string::npos)};
                }
                return {"", path};
            }